

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

void __thiscall wasm::Flow::Flow(Flow *this,Literal *value)

{
  initializer_list<wasm::Literal> init;
  Literal local_38;
  
  wasm::Literal::Literal(&local_38,value);
  init._M_len = 1;
  init._M_array = &local_38;
  Literals::Literals(&this->values,init);
  wasm::Literal::~Literal(&local_38);
  (this->breakTo).super_IString.str._M_len = 0;
  (this->breakTo).super_IString.str._M_str = (char *)0x0;
  if (1 < (value->type).id) {
    return;
  }
  __assert_fail("value.type.isConcrete()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                ,0x38,"wasm::Flow::Flow(Literal)");
}

Assistant:

Flow(Literal value) : values{value} { assert(value.type.isConcrete()); }